

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_layer_weights(void)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  vector<double,_std::allocator<double>_> weights;
  string local_260;
  string file_name;
  ofstream fout_weights;
  
  calculate_global_layer_weights();
  if (mpi_rank == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fout_weights,&data_folder_abi_cxx11_,"/weights");
    OutputIterations::get_current_iteration_string_abi_cxx11_(&local_260,&output_iterations);
    std::operator+(&file_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fout_weights,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&fout_weights);
    std::ofstream::ofstream(&fout_weights,file_name._M_dataplus._M_p,_S_out);
    uVar1 = (uint)((ulong)((long)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
    for (uVar3 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar3; uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<double>
                         (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
      std::operator<<(poVar2,"\n");
    }
    std::ofstream::~ofstream(&fout_weights);
    std::__cxx11::string::~string((string *)&file_name);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void write_layer_weights() {
    auto weights = calculate_global_layer_weights();

    if (mpi_rank == 0) {
        const std::string file_name = data_folder + "/weights" + output_iterations.get_current_iteration_string();

        ofstream fout_weights(file_name.c_str(), ios_base::out);

        int length = weights.size();
        for (int i = 0; i < length; i++) {
            fout_weights << weights[i] << "\n";
        }
    }
}